

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O0

string * __thiscall
cmLinkLineComputer::ConvertToLinkReference
          (string *__return_storage_ptr__,cmLinkLineComputer *this,string *lib)

{
  bool bVar1;
  char *pcVar2;
  allocator local_99;
  string local_98;
  string local_78;
  allocator local_55 [13];
  string local_48;
  undefined1 local_21;
  string *local_20;
  string *lib_local;
  cmLinkLineComputer *this_local;
  string *relLib;
  
  local_21 = 0;
  local_20 = lib;
  lib_local = (string *)this;
  this_local = (cmLinkLineComputer *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)lib);
  pcVar2 = cmStateDirectory::GetCurrentBinary(&this->StateDir);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,pcVar2,local_55);
  bVar1 = cmOutputConverter::ContainedInDirectory(&local_48,local_20,&this->StateDir);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)local_55);
  if (bVar1) {
    pcVar2 = cmStateDirectory::GetCurrentBinary(&this->StateDir);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,pcVar2,&local_99);
    cmOutputConverter::ForceToRelativePath(&local_78,&local_98,local_20);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLinkLineComputer::ConvertToLinkReference(
  std::string const& lib) const
{
  std::string relLib = lib;

  if (cmOutputConverter::ContainedInDirectory(
        this->StateDir.GetCurrentBinary(), lib, this->StateDir)) {
    relLib = cmOutputConverter::ForceToRelativePath(
      this->StateDir.GetCurrentBinary(), lib);
  }
  return relLib;
}